

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O3

void __thiscall
Am_Drawonable_Impl::Get_String_Extents
          (Am_Drawonable_Impl *this,Am_Font *Am_font,char *the_string,int the_string_length,
          int *width,int *ascent,int *descent,int *left_bearing,int *right_bearing)

{
  uint *puVar1;
  Am_Font_Data *this_00;
  int iVar2;
  XFontStruct *pXVar3;
  undefined1 local_40 [4];
  short local_3c;
  short local_3a;
  short local_38;
  
  this_00 = Am_font->data;
  if (this_00 != (Am_Font_Data *)0x0) {
    puVar1 = &(this_00->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
    iVar2 = (**(this_00->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type)
                      (this_00);
    if ((Am_ID_Tag)iVar2 == Am_Font_Data::id) {
      if (this_00->family - Am_FONT_JFIXED < 4) {
        iVar2 = unwrap_j(the_string,the_string_length);
        pXVar3 = Am_Font_Data::Get_X_Font(this_00,this);
        XTextExtents16(pXVar3,buf16,iVar2,local_40,ascent,descent,&local_3c);
      }
      else {
        pXVar3 = Am_Font_Data::Get_X_Font(this_00,this);
        XTextExtents(pXVar3,the_string,the_string_length,local_40,ascent,descent,&local_3c);
      }
      *width = (int)local_38;
      *left_bearing = (int)local_3c;
      *right_bearing = (int)local_3a;
      puVar1 = &(this_00->super_Am_Wrapper).refs;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 != 0) {
        return;
      }
      (*(this_00->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(this_00);
      return;
    }
  }
  *width = 0;
  *ascent = 0;
  *descent = 0;
  *left_bearing = 0;
  *right_bearing = 0;
  return;
}

Assistant:

void
Am_Drawonable_Impl::Get_String_Extents(const Am_Font &Am_font,
                                       const char *the_string,
                                       int the_string_length, int &width,
                                       int &ascent, int &descent,
                                       int &left_bearing, int &right_bearing)
{
  int the_direction;
  XCharStruct the_overall;

  Am_Font_Data *font = Am_Font_Data::Narrow(Am_font);

  if (font) {
    Am_Font_Family_Flag family;
    bool is_bold, is_italic, is_underline;
    Am_Font_Size_Flag size;
    font->Get_Values(family, is_bold, is_italic, is_underline, size);
    if (family == Am_FONT_JFIXED || family == Am_FONT_JPROPORTIONAL ||
        family == Am_FONT_KFIXED || family == Am_FONT_CFIXED) {
      the_string_length = unwrap_j(the_string, the_string_length);
      XTextExtents16(font->Get_X_Font(this), buf16, the_string_length,
                     &the_direction, &ascent, &descent, &the_overall);
    } else
      XTextExtents(font->Get_X_Font(this), the_string, the_string_length,
                   &the_direction, &ascent, &descent, &the_overall);
    width = the_overall.width;
    left_bearing = the_overall.lbearing;
    right_bearing = the_overall.rbearing;
    font->Release();
  } else {
    width = 0;
    ascent = 0;
    descent = 0;
    left_bearing = 0;
    right_bearing = 0;
  }
}